

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_certificate.cc
# Opt level: O0

bool __thiscall
bssl::ParseBasicConstraints(bssl *this,Input basic_constraints_tlv,ParsedBasicConstraints *out)

{
  Input in;
  Input input;
  bool bVar1;
  bool *present;
  Input in_00;
  undefined1 local_a0 [8];
  Input encoded_path_len;
  undefined1 local_80 [8];
  Input ca;
  undefined1 local_68 [7];
  bool has_ca;
  Parser sequence_parser;
  undefined1 local_40 [8];
  Parser parser;
  ParsedBasicConstraints *out_local;
  Input basic_constraints_tlv_local;
  
  parser.advance_len_ = basic_constraints_tlv.data_.size_;
  input.data_.size_ = (size_t)basic_constraints_tlv.data_.data_;
  input.data_.data_ = (uchar *)this;
  sequence_parser.advance_len_ = (size_t)this;
  der::Parser::Parser((Parser *)local_40,input);
  der::Parser::Parser((Parser *)local_68);
  bVar1 = der::Parser::ReadSequence((Parser *)local_40,(Parser *)local_68);
  if (bVar1) {
    *(undefined1 *)parser.advance_len_ = 0;
    der::Input::Input((Input *)local_80);
    bVar1 = der::Parser::ReadOptionalTag
                      ((Parser *)local_68,1,(Input *)local_80,(bool *)((long)&ca.data_.size_ + 7));
    if (bVar1) {
      if ((ca.data_.size_._7_1_ & 1) != 0) {
        encoded_path_len.data_.size_ = (size_t)local_80;
        in.data_.size_ = (size_t)ca.data_.data_;
        in.data_.data_ = (uchar *)local_80;
        bVar1 = der::ParseBool(in,(bool *)parser.advance_len_);
        if (!bVar1) {
          return false;
        }
      }
      der::Input::Input((Input *)local_a0);
      present = (bool *)(parser.advance_len_ + 1);
      bVar1 = der::Parser::ReadOptionalTag((Parser *)local_68,2,(Input *)local_a0,present);
      if (bVar1) {
        if ((*(byte *)(parser.advance_len_ + 1) & 1) == 0) {
          *(undefined1 *)(parser.advance_len_ + 2) = 0;
        }
        else {
          in_00.data_.size_ = parser.advance_len_ + 2;
          in_00.data_.data_ = encoded_path_len.data_.data_;
          bVar1 = der::ParseUint8((der *)local_a0,in_00,present);
          if (!bVar1) {
            return false;
          }
        }
        bVar1 = der::Parser::HasMore((Parser *)local_68);
        if (bVar1) {
          basic_constraints_tlv_local.data_.size_._7_1_ = false;
        }
        else {
          bVar1 = der::Parser::HasMore((Parser *)local_40);
          if (bVar1) {
            basic_constraints_tlv_local.data_.size_._7_1_ = false;
          }
          else {
            basic_constraints_tlv_local.data_.size_._7_1_ = true;
          }
        }
      }
      else {
        basic_constraints_tlv_local.data_.size_._7_1_ = false;
      }
    }
    else {
      basic_constraints_tlv_local.data_.size_._7_1_ = false;
    }
  }
  else {
    basic_constraints_tlv_local.data_.size_._7_1_ = false;
  }
  return basic_constraints_tlv_local.data_.size_._7_1_;
}

Assistant:

bool ParseBasicConstraints(der::Input basic_constraints_tlv,
                           ParsedBasicConstraints *out) {
  der::Parser parser(basic_constraints_tlv);

  //    BasicConstraints ::= SEQUENCE {
  der::Parser sequence_parser;
  if (!parser.ReadSequence(&sequence_parser)) {
    return false;
  }

  //         cA                      BOOLEAN DEFAULT FALSE,
  out->is_ca = false;
  bool has_ca;
  der::Input ca;
  if (!sequence_parser.ReadOptionalTag(CBS_ASN1_BOOLEAN, &ca, &has_ca)) {
    return false;
  }
  if (has_ca) {
    if (!der::ParseBool(ca, &out->is_ca)) {
      return false;
    }
    // TODO(eroman): Should reject if CA was set to false, since
    // DER-encoding requires DEFAULT values be omitted. In
    // practice however there are a lot of certificates that use
    // the broken encoding.
  }

  //         pathLenConstraint       INTEGER (0..MAX) OPTIONAL }
  der::Input encoded_path_len;
  if (!sequence_parser.ReadOptionalTag(CBS_ASN1_INTEGER, &encoded_path_len,
                                       &out->has_path_len)) {
    return false;
  }
  if (out->has_path_len) {
    // TODO(eroman): Surface reason for failure if length was longer than uint8.
    if (!der::ParseUint8(encoded_path_len, &out->path_len)) {
      return false;
    }
  } else {
    // Default initialize to 0 as a precaution.
    out->path_len = 0;
  }

  // There shouldn't be any unconsumed data in the extension.
  if (sequence_parser.HasMore()) {
    return false;
  }

  // By definition the input was a single BasicConstraints sequence, so there
  // shouldn't be unconsumed data.
  if (parser.HasMore()) {
    return false;
  }

  return true;
}